

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwWindowHint(int target,int hint)

{
  GLboolean GVar1;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
  }
  else {
    GVar1 = (GLboolean)hint;
    if (target < 0x21001) {
      if (target == 0x20003) {
        _glfw.hints.resizable = GVar1;
        return;
      }
      if (target == 0x20004) {
        _glfw.hints.visible = GVar1;
        return;
      }
      if (target == 0x20005) {
        _glfw.hints.decorated = GVar1;
        return;
      }
    }
    else {
      switch(target) {
      case 0x21001:
        _glfw.hints.redBits = hint;
        return;
      case 0x21002:
        _glfw.hints.greenBits = hint;
        return;
      case 0x21003:
        _glfw.hints.blueBits = hint;
        return;
      case 0x21004:
        _glfw.hints.alphaBits = hint;
        return;
      case 0x21005:
        _glfw.hints.depthBits = hint;
        return;
      case 0x21006:
        _glfw.hints.stencilBits = hint;
        return;
      case 0x21007:
        _glfw.hints.accumRedBits = hint;
        return;
      case 0x21008:
        _glfw.hints.accumGreenBits = hint;
        return;
      case 0x21009:
        _glfw.hints.accumBlueBits = hint;
        return;
      case 0x2100a:
        _glfw.hints.accumAlphaBits = hint;
        return;
      case 0x2100b:
        _glfw.hints.auxBuffers = hint;
        return;
      case 0x2100c:
        _glfw.hints.stereo = GVar1;
        return;
      case 0x2100d:
        _glfw.hints.samples = hint;
        return;
      case 0x2100e:
        _glfw.hints.sRGB = GVar1;
        return;
      case 0x2100f:
        _glfw.hints.refreshRate = hint;
        return;
      }
      switch(target) {
      case 0x22001:
        _glfw.hints.clientAPI = hint;
        return;
      case 0x22002:
        _glfw.hints.glMajor = hint;
        return;
      case 0x22003:
        _glfw.hints.glMinor = hint;
        return;
      case 0x22005:
        _glfw.hints.glRobustness = hint;
        return;
      case 0x22006:
        _glfw.hints.glForward = GVar1;
        return;
      case 0x22007:
        _glfw.hints.glDebug = GVar1;
        return;
      case 0x22008:
        _glfw.hints.glProfile = hint;
        return;
      }
    }
    error = 0x10003;
  }
  _glfwInputError(error,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int target, int hint)
{
    _GLFW_REQUIRE_INIT();

    switch (target)
    {
        case GLFW_RED_BITS:
            _glfw.hints.redBits = hint;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.greenBits = hint;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.blueBits = hint;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.alphaBits = hint;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.depthBits = hint;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.stencilBits = hint;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.accumRedBits = hint;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.accumGreenBits = hint;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.accumBlueBits = hint;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.accumAlphaBits = hint;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.auxBuffers = hint;
            break;
        case GLFW_STEREO:
            _glfw.hints.stereo = hint;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = hint;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.resizable = hint;
            break;
        case GLFW_DECORATED:
            _glfw.hints.decorated = hint;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.visible = hint;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.samples = hint;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.sRGB = hint;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.clientAPI = hint;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.glMajor = hint;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.glMinor = hint;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.glRobustness = hint;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.glForward = hint;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.glDebug = hint;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.glProfile = hint;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, NULL);
            break;
    }
}